

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O0

int32_t ucnv_swap_63(UDataSwapper *ds,void *inData,int32_t length,void *outData,
                    UErrorCode *pErrorCode)

{
  UDataSwapFn *pUVar1;
  UBool UVar2;
  byte bVar3;
  int32_t iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int32_t iVar14;
  uint32_t *__src;
  uint32_t *__dest;
  size_t sVar15;
  uint *__src_00;
  uint *__dest_00;
  byte *pbVar16;
  byte *pbVar17;
  bool bVar18;
  uint32_t local_124;
  char *outBaseName;
  char *inBaseName;
  byte *pbStack_c8;
  int32_t extOffset;
  int32_t *inExtIndexes;
  int32_t mbcsIndexLength;
  int32_t maxFastUChar;
  byte bStack_af;
  uint8_t outputType;
  UBool noFromU;
  uint32_t mbcsHeaderLength;
  _MBCSHeader mbcsHeader;
  _MBCSHeader *outMBCSHeader;
  _MBCSHeader *inMBCSHeader;
  UConverterStaticData *outStaticData;
  UConverterStaticData *inStaticData;
  int32_t size;
  uint32_t staticDataSize;
  uint32_t count;
  uint32_t offset;
  uint8_t *outBytes;
  uint8_t *inBytes;
  int32_t headerSize;
  UDataInfo *pInfo;
  UErrorCode *pErrorCode_local;
  void *outData_local;
  int32_t length_local;
  void *inData_local;
  UDataSwapper *ds_local;
  
  bVar18 = false;
  iVar4 = udata_swapDataHeader_63(ds,inData,length,outData,pErrorCode);
  if ((pErrorCode == (UErrorCode *)0x0) || (UVar2 = U_FAILURE(*pErrorCode), UVar2 != '\0')) {
    ds_local._4_4_ = 0;
  }
  else if ((((*(char *)((long)inData + 0xc) == 'c') && (*(char *)((long)inData + 0xd) == 'n')) &&
           (*(char *)((long)inData + 0xe) == 'v')) &&
          (((*(char *)((long)inData + 0xf) == 't' && (*(char *)((long)inData + 0x10) == '\x06')) &&
           (1 < *(byte *)((long)inData + 0x11))))) {
    __src = (uint32_t *)((long)inData + (long)iVar4);
    __dest = (uint32_t *)((long)outData + (long)iVar4);
    if (length < 0) {
      inStaticData._4_4_ = (*ds->readUInt32)(*__src);
      outData_local._4_4_ = length;
    }
    else {
      outData_local._4_4_ = length - iVar4;
      if (((int)outData_local._4_4_ < 100) ||
         (inStaticData._4_4_ = (*ds->readUInt32)(*__src), outData_local._4_4_ < inStaticData._4_4_))
      {
        udata_printError_63(ds,
                            "ucnv_swap(): too few bytes (%d after header) for an ICU .cnv conversion table\n"
                            ,(ulong)outData_local._4_4_);
        *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
      }
    }
    if (-1 < (int)outData_local._4_4_) {
      if (__src != __dest) {
        memcpy(__dest,__src,(ulong)inStaticData._4_4_);
      }
      (*ds->swapArray32)(ds,__src,4,__dest,pErrorCode);
      (*ds->swapArray32)(ds,__src + 0x10,4,__dest + 0x10,pErrorCode);
      pUVar1 = ds->swapInvChars;
      sVar15 = strlen((char *)(__src + 1));
      (*pUVar1)(ds,__src + 1,(int32_t)sVar15,__dest + 1,pErrorCode);
      UVar2 = U_FAILURE(*pErrorCode);
      if (UVar2 != '\0') {
        udata_printError_63(ds,"ucnv_swap(): error swapping converter name\n");
        return 0;
      }
    }
    __src_00 = (uint *)((long)__src + (ulong)inStaticData._4_4_);
    __dest_00 = (uint *)((long)__dest + (ulong)inStaticData._4_4_);
    if (-1 < (int)outData_local._4_4_) {
      outData_local._4_4_ = outData_local._4_4_ - inStaticData._4_4_;
    }
    if (*(char *)((long)__src + 0x45) == '\x02') {
      if (((int)outData_local._4_4_ < 0) || (0x27 < (int)outData_local._4_4_)) {
        if (((byte)*__src_00 == 4) && (*(byte *)((long)__src_00 + 1) != 0)) {
          maxFastUChar = 8;
        }
        else {
          if ((((byte)*__src_00 != 5) || (*(byte *)((long)__src_00 + 1) < 3)) ||
             (uVar5 = (*ds->readUInt32)(__src_00[8]), (uVar5 & 0xff80) != 0)) {
            udata_printError_63(ds,"ucnv_swap(): unsupported _MBCSHeader.version %d.%d\n",
                                (ulong)(byte)*__src_00,(ulong)*(byte *)((long)__src_00 + 1));
            *pErrorCode = U_UNSUPPORTED_ERROR;
            return 0;
          }
          maxFastUChar = uVar5 & 0x3f;
          bVar18 = (uVar5 & 0x40) != 0;
        }
        uVar13 = *__src_00;
        uVar5 = (*ds->readUInt32)(__src_00[1]);
        uVar6 = (*ds->readUInt32)(__src_00[2]);
        uVar7 = (*ds->readUInt32)(__src_00[3]);
        uVar8 = (*ds->readUInt32)(__src_00[4]);
        uVar9 = (*ds->readUInt32)(__src_00[5]);
        uVar10 = (*ds->readUInt32)(__src_00[6]);
        local_124 = (*ds->readUInt32)(__src_00[7]);
        uVar11 = uVar10 >> 8;
        bVar3 = (byte)uVar10;
        if ((bVar18) && (bVar3 == 0)) {
          udata_printError_63(ds,
                              "ucnv_swap(): unsupported combination of makeconv --small with SBCS\n"
                             );
          *pErrorCode = U_UNSUPPORTED_ERROR;
          ds_local._4_4_ = 0;
        }
        else {
          uVar12 = uVar10 & 0xff;
          if (((uVar12 < 4) || ((uVar12 - 8 < 2 || (uVar12 == 0xc)))) || (uVar12 == 0xe)) {
            inExtIndexes._0_4_ = 0;
            if ((((bVar3 != 0xe) && (bVar3 != 0)) &&
                (bStack_af = (byte)(uVar13 >> 8), 2 < bStack_af)) &&
               (uVar13 = uVar13 >> 0x10 & 0xff, uVar13 != 0)) {
              inExtIndexes._0_4_ = ((int)((uVar13 << 8 | 0xff) + 1) >> 6) << 1;
            }
            if (uVar11 == 0) {
              inStaticData._0_4_ = uVar9 + (int)inExtIndexes;
              if (!bVar18) {
                inStaticData._0_4_ = local_124 + (int)inStaticData;
              }
              pbStack_c8 = (byte *)0x0;
            }
            else {
              if ((-1 < (int)outData_local._4_4_) &&
                 ((int)outData_local._4_4_ < (int)(uVar11 + 0x80))) {
                udata_printError_63(ds,
                                    "ucnv_swap(): too few bytes (%d after headers) for an ICU MBCS .cnv conversion table with extension data\n"
                                    ,(ulong)outData_local._4_4_);
                *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
                return 0;
              }
              pbStack_c8 = (byte *)((long)__src_00 + (long)(int)uVar11);
              iVar14 = udata_readInt32_63(ds,*(int32_t *)(pbStack_c8 + 0x7c));
              inStaticData._0_4_ = uVar11 + iVar14;
            }
            if (-1 < (int)outData_local._4_4_) {
              if ((int)outData_local._4_4_ < (int)inStaticData) {
                udata_printError_63(ds,
                                    "ucnv_swap(): too few bytes (%d after headers) for an ICU MBCS .cnv conversion table\n"
                                    ,(ulong)outData_local._4_4_);
                *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
                return 0;
              }
              if (__src_00 != __dest_00) {
                memcpy(__dest_00,__src_00,(long)(int)inStaticData);
              }
              uVar13 = maxFastUChar * 4;
              (*ds->swapArray32)(ds,__src_00 + 1,uVar13 - 4,__dest_00 + 1,pErrorCode);
              if (bVar3 == 0xe) {
                pUVar1 = ds->swapInvChars;
                sVar15 = strlen((char *)((long)__src_00 + (ulong)uVar13));
                (*pUVar1)(ds,(byte *)((long)__src_00 + (ulong)uVar13),(int32_t)sVar15,
                          (byte *)((long)__dest_00 + (ulong)uVar13),pErrorCode);
              }
              else {
                (*ds->swapArray32)(ds,(byte *)((long)__src_00 + (ulong)uVar13),uVar5 * 0x400,
                                   (byte *)((long)__dest_00 + (ulong)uVar13),pErrorCode);
                uVar13 = uVar5 * 0x400 + uVar13;
                (*ds->swapArray32)(ds,(byte *)((long)__src_00 + (ulong)uVar13),uVar6 << 3,
                                   (byte *)((long)__dest_00 + (ulong)uVar13),pErrorCode);
                (*ds->swapArray16)(ds,(byte *)((long)__src_00 + (ulong)uVar7),uVar8 - uVar7,
                                   (byte *)((long)__dest_00 + (ulong)uVar7),pErrorCode);
                if (bVar3 == 0) {
                  (*ds->swapArray16)(ds,(byte *)((long)__src_00 + (ulong)uVar8),
                                     (uVar9 - uVar8) + local_124,
                                     (byte *)((long)__dest_00 + (ulong)uVar8),pErrorCode);
                }
                else {
                  if ((*(byte *)((long)__src + 0x4f) & 1) == 0) {
                    size = 0x80;
                  }
                  else {
                    size = 0x880;
                  }
                  (*ds->swapArray16)(ds,(byte *)((long)__src_00 + (ulong)uVar8),size,
                                     (byte *)((long)__dest_00 + (ulong)uVar8),pErrorCode);
                  uVar13 = size + uVar8;
                  (*ds->swapArray32)(ds,(byte *)((long)__src_00 + (ulong)uVar13),uVar9 - uVar13,
                                     (byte *)((long)__dest_00 + (ulong)uVar13),pErrorCode);
                  if (bVar18) {
                    local_124 = 0;
                  }
                  switch(uVar10 & 0xff) {
                  case 1:
                  case 8:
                  case 0xc:
                    (*ds->swapArray16)(ds,(byte *)((long)__src_00 + (ulong)uVar9),local_124,
                                       (byte *)((long)__dest_00 + (ulong)uVar9),pErrorCode);
                    break;
                  default:
                    break;
                  case 3:
                    (*ds->swapArray32)(ds,(byte *)((long)__src_00 + (ulong)uVar9),local_124,
                                       (byte *)((long)__dest_00 + (ulong)uVar9),pErrorCode);
                  }
                  if ((int)inExtIndexes != 0) {
                    (*ds->swapArray16)(ds,(byte *)((long)__src_00 + (ulong)(local_124 + uVar9)),
                                       (int)inExtIndexes,
                                       (byte *)((long)__dest_00 + (ulong)(local_124 + uVar9)),
                                       pErrorCode);
                  }
                }
              }
              if (uVar11 != 0) {
                pbVar16 = (byte *)((long)__src_00 + (long)(int)uVar11);
                pbVar17 = (byte *)((long)__dest_00 + (long)(int)uVar11);
                uVar13 = udata_readInt32_63(ds,*(int32_t *)(pbStack_c8 + 4));
                iVar14 = udata_readInt32_63(ds,*(int32_t *)(pbStack_c8 + 8));
                (*ds->swapArray32)(ds,pbVar16 + uVar13,iVar14 << 2,pbVar17 + uVar13,pErrorCode);
                uVar13 = udata_readInt32_63(ds,*(int32_t *)(pbStack_c8 + 0xc));
                iVar14 = udata_readInt32_63(ds,*(int32_t *)(pbStack_c8 + 0x10));
                (*ds->swapArray16)(ds,pbVar16 + uVar13,iVar14 << 1,pbVar17 + uVar13,pErrorCode);
                uVar13 = udata_readInt32_63(ds,*(int32_t *)(pbStack_c8 + 0x14));
                iVar14 = udata_readInt32_63(ds,*(int32_t *)(pbStack_c8 + 0x1c));
                (*ds->swapArray16)(ds,pbVar16 + uVar13,iVar14 << 1,pbVar17 + uVar13,pErrorCode);
                uVar13 = udata_readInt32_63(ds,*(int32_t *)(pbStack_c8 + 0x18));
                (*ds->swapArray32)(ds,pbVar16 + uVar13,iVar14 << 2,pbVar17 + uVar13,pErrorCode);
                uVar13 = udata_readInt32_63(ds,*(int32_t *)(pbStack_c8 + 0x28));
                iVar14 = udata_readInt32_63(ds,*(int32_t *)(pbStack_c8 + 0x30));
                (*ds->swapArray16)(ds,pbVar16 + uVar13,iVar14 << 1,pbVar17 + uVar13,pErrorCode);
                uVar13 = udata_readInt32_63(ds,*(int32_t *)(pbStack_c8 + 0x34));
                iVar14 = udata_readInt32_63(ds,*(int32_t *)(pbStack_c8 + 0x38));
                (*ds->swapArray16)(ds,pbVar16 + uVar13,iVar14 << 1,pbVar17 + uVar13,pErrorCode);
                uVar13 = udata_readInt32_63(ds,*(int32_t *)(pbStack_c8 + 0x3c));
                iVar14 = udata_readInt32_63(ds,*(int32_t *)(pbStack_c8 + 0x40));
                (*ds->swapArray32)(ds,pbVar16 + uVar13,iVar14 << 2,pbVar17 + uVar13,pErrorCode);
                iVar14 = udata_readInt32_63(ds,*(int32_t *)pbStack_c8);
                (*ds->swapArray32)(ds,pbVar16,iVar14 << 2,pbVar17,pErrorCode);
              }
            }
            ds_local._4_4_ = iVar4 + inStaticData._4_4_ + (int)inStaticData;
          }
          else {
            udata_printError_63(ds,"ucnv_swap(): unsupported MBCS output type 0x%x\n",(ulong)bVar3);
            *pErrorCode = U_UNSUPPORTED_ERROR;
            ds_local._4_4_ = 0;
          }
        }
      }
      else {
        udata_printError_63(ds,
                            "ucnv_swap(): too few bytes (%d after headers) for an ICU MBCS .cnv conversion table\n"
                            ,(ulong)outData_local._4_4_);
        *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        ds_local._4_4_ = 0;
      }
    }
    else {
      udata_printError_63(ds,"ucnv_swap(): unknown conversionType=%d!=UCNV_MBCS\n",
                          (ulong)(uint)(int)*(char *)((long)__src + 0x45));
      *pErrorCode = U_UNSUPPORTED_ERROR;
      ds_local._4_4_ = 0;
    }
  }
  else {
    udata_printError_63(ds,
                        "ucnv_swap(): data format %02x.%02x.%02x.%02x (format version %02x.%02x) is not recognized as an ICU .cnv conversion table\n"
                        ,(ulong)*(byte *)((long)inData + 0xc),(ulong)*(byte *)((long)inData + 0xd),
                        (ulong)*(byte *)((long)inData + 0xe),(ulong)*(byte *)((long)inData + 0xf),
                        (uint)*(byte *)((long)inData + 0x10),(uint)*(byte *)((long)inData + 0x11));
    *pErrorCode = U_UNSUPPORTED_ERROR;
    ds_local._4_4_ = 0;
  }
  return ds_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucnv_swap(const UDataSwapper *ds,
          const void *inData, int32_t length, void *outData,
          UErrorCode *pErrorCode) {
    const UDataInfo *pInfo;
    int32_t headerSize;

    const uint8_t *inBytes;
    uint8_t *outBytes;

    uint32_t offset, count, staticDataSize;
    int32_t size;

    const UConverterStaticData *inStaticData;
    UConverterStaticData *outStaticData;

    const _MBCSHeader *inMBCSHeader;
    _MBCSHeader *outMBCSHeader;
    _MBCSHeader mbcsHeader;
    uint32_t mbcsHeaderLength;
    UBool noFromU=FALSE;

    uint8_t outputType;

    int32_t maxFastUChar, mbcsIndexLength;

    const int32_t *inExtIndexes;
    int32_t extOffset;

    /* udata_swapDataHeader checks the arguments */
    headerSize=udata_swapDataHeader(ds, inData, length, outData, pErrorCode);
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    /* check data format and format version */
    pInfo=(const UDataInfo *)((const char *)inData+4);
    if(!(
        pInfo->dataFormat[0]==0x63 &&   /* dataFormat="cnvt" */
        pInfo->dataFormat[1]==0x6e &&
        pInfo->dataFormat[2]==0x76 &&
        pInfo->dataFormat[3]==0x74 &&
        pInfo->formatVersion[0]==6 &&
        pInfo->formatVersion[1]>=2
    )) {
        udata_printError(ds, "ucnv_swap(): data format %02x.%02x.%02x.%02x (format version %02x.%02x) is not recognized as an ICU .cnv conversion table\n",
                         pInfo->dataFormat[0], pInfo->dataFormat[1],
                         pInfo->dataFormat[2], pInfo->dataFormat[3],
                         pInfo->formatVersion[0], pInfo->formatVersion[1]);
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    inBytes=(const uint8_t *)inData+headerSize;
    outBytes=(uint8_t *)outData+headerSize;

    /* read the initial UConverterStaticData structure after the UDataInfo header */
    inStaticData=(const UConverterStaticData *)inBytes;
    outStaticData=(UConverterStaticData *)outBytes;

    if(length<0) {
        staticDataSize=ds->readUInt32(inStaticData->structSize);
    } else {
        length-=headerSize;
        if( length<(int32_t)sizeof(UConverterStaticData) ||
            (uint32_t)length<(staticDataSize=ds->readUInt32(inStaticData->structSize))
        ) {
            udata_printError(ds, "ucnv_swap(): too few bytes (%d after header) for an ICU .cnv conversion table\n",
                             length);
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
    }

    if(length>=0) {
        /* swap the static data */
        if(inStaticData!=outStaticData) {
            uprv_memcpy(outStaticData, inStaticData, staticDataSize);
        }

        ds->swapArray32(ds, &inStaticData->structSize, 4,
                           &outStaticData->structSize, pErrorCode);
        ds->swapArray32(ds, &inStaticData->codepage, 4,
                           &outStaticData->codepage, pErrorCode);

        ds->swapInvChars(ds, inStaticData->name, (int32_t)uprv_strlen(inStaticData->name),
                            outStaticData->name, pErrorCode);
        if(U_FAILURE(*pErrorCode)) {
            udata_printError(ds, "ucnv_swap(): error swapping converter name\n");
            return 0;
        }
    }

    inBytes+=staticDataSize;
    outBytes+=staticDataSize;
    if(length>=0) {
        length-=(int32_t)staticDataSize;
    }

    /* check for supported conversionType values */
    if(inStaticData->conversionType==UCNV_MBCS) {
        /* swap MBCS data */
        inMBCSHeader=(const _MBCSHeader *)inBytes;
        outMBCSHeader=(_MBCSHeader *)outBytes;

        if(0<=length && length<(int32_t)sizeof(_MBCSHeader)) {
            udata_printError(ds, "ucnv_swap(): too few bytes (%d after headers) for an ICU MBCS .cnv conversion table\n",
                                length);
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
        if(inMBCSHeader->version[0]==4 && inMBCSHeader->version[1]>=1) {
            mbcsHeaderLength=MBCS_HEADER_V4_LENGTH;
        } else if(inMBCSHeader->version[0]==5 && inMBCSHeader->version[1]>=3 &&
                  ((mbcsHeader.options=ds->readUInt32(inMBCSHeader->options))&
                   MBCS_OPT_UNKNOWN_INCOMPATIBLE_MASK)==0
        ) {
            mbcsHeaderLength=mbcsHeader.options&MBCS_OPT_LENGTH_MASK;
            noFromU=(UBool)((mbcsHeader.options&MBCS_OPT_NO_FROM_U)!=0);
        } else {
            udata_printError(ds, "ucnv_swap(): unsupported _MBCSHeader.version %d.%d\n",
                             inMBCSHeader->version[0], inMBCSHeader->version[1]);
            *pErrorCode=U_UNSUPPORTED_ERROR;
            return 0;
        }

        uprv_memcpy(mbcsHeader.version, inMBCSHeader->version, 4);
        mbcsHeader.countStates=         ds->readUInt32(inMBCSHeader->countStates);
        mbcsHeader.countToUFallbacks=   ds->readUInt32(inMBCSHeader->countToUFallbacks);
        mbcsHeader.offsetToUCodeUnits=  ds->readUInt32(inMBCSHeader->offsetToUCodeUnits);
        mbcsHeader.offsetFromUTable=    ds->readUInt32(inMBCSHeader->offsetFromUTable);
        mbcsHeader.offsetFromUBytes=    ds->readUInt32(inMBCSHeader->offsetFromUBytes);
        mbcsHeader.flags=               ds->readUInt32(inMBCSHeader->flags);
        mbcsHeader.fromUBytesLength=    ds->readUInt32(inMBCSHeader->fromUBytesLength);
        /* mbcsHeader.options have been read above */

        extOffset=(int32_t)(mbcsHeader.flags>>8);
        outputType=(uint8_t)mbcsHeader.flags;
        if(noFromU && outputType==MBCS_OUTPUT_1) {
            udata_printError(ds, "ucnv_swap(): unsupported combination of makeconv --small with SBCS\n");
            *pErrorCode=U_UNSUPPORTED_ERROR;
            return 0;
        }

        /* make sure that the output type is known */
        switch(outputType) {
        case MBCS_OUTPUT_1:
        case MBCS_OUTPUT_2:
        case MBCS_OUTPUT_3:
        case MBCS_OUTPUT_4:
        case MBCS_OUTPUT_3_EUC:
        case MBCS_OUTPUT_4_EUC:
        case MBCS_OUTPUT_2_SISO:
        case MBCS_OUTPUT_EXT_ONLY:
            /* OK */
            break;
        default:
            udata_printError(ds, "ucnv_swap(): unsupported MBCS output type 0x%x\n",
                             outputType);
            *pErrorCode=U_UNSUPPORTED_ERROR;
            return 0;
        }

        /* calculate the length of the MBCS data */

        /*
         * utf8Friendly MBCS files (mbcsHeader.version 4.3)
         * contain an additional mbcsIndex table:
         *   uint16_t[(maxFastUChar+1)>>6];
         * where maxFastUChar=((mbcsHeader.version[2]<<8)|0xff).
         */
        maxFastUChar=0;
        mbcsIndexLength=0;
        if( outputType!=MBCS_OUTPUT_EXT_ONLY && outputType!=MBCS_OUTPUT_1 &&
            mbcsHeader.version[1]>=3 && (maxFastUChar=mbcsHeader.version[2])!=0
        ) {
            maxFastUChar=(maxFastUChar<<8)|0xff;
            mbcsIndexLength=((maxFastUChar+1)>>6)*2;  /* number of bytes */
        }

        if(extOffset==0) {
            size=(int32_t)(mbcsHeader.offsetFromUBytes+mbcsIndexLength);
            if(!noFromU) {
                size+=(int32_t)mbcsHeader.fromUBytesLength;
            }

            /* avoid compiler warnings - not otherwise necessary, and the value does not matter */
            inExtIndexes=NULL;
        } else {
            /* there is extension data after the base data, see ucnv_ext.h */
            if(length>=0 && length<(extOffset+UCNV_EXT_INDEXES_MIN_LENGTH*4)) {
                udata_printError(ds, "ucnv_swap(): too few bytes (%d after headers) for an ICU MBCS .cnv conversion table with extension data\n",
                                 length);
                *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                return 0;
            }

            inExtIndexes=(const int32_t *)(inBytes+extOffset);
            size=extOffset+udata_readInt32(ds, inExtIndexes[UCNV_EXT_SIZE]);
        }

        if(length>=0) {
            if(length<size) {
                udata_printError(ds, "ucnv_swap(): too few bytes (%d after headers) for an ICU MBCS .cnv conversion table\n",
                                 length);
                *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
                return 0;
            }

            /* copy the data for inaccessible bytes */
            if(inBytes!=outBytes) {
                uprv_memcpy(outBytes, inBytes, size);
            }

            /* swap the MBCSHeader, except for the version field */
            count=mbcsHeaderLength*4;
            ds->swapArray32(ds, &inMBCSHeader->countStates, count-4,
                               &outMBCSHeader->countStates, pErrorCode);

            if(outputType==MBCS_OUTPUT_EXT_ONLY) {
                /*
                 * extension-only file,
                 * contains a base name instead of normal base table data
                 */

                /* swap the base name, between the header and the extension data */
                const char *inBaseName=(const char *)inBytes+count;
                char *outBaseName=(char *)outBytes+count;
                ds->swapInvChars(ds, inBaseName, (int32_t)uprv_strlen(inBaseName),
                                    outBaseName, pErrorCode);
            } else {
                /* normal file with base table data */

                /* swap the state table, 1kB per state */
                offset=count;
                count=mbcsHeader.countStates*1024;
                ds->swapArray32(ds, inBytes+offset, (int32_t)count,
                                   outBytes+offset, pErrorCode);

                /* swap the toUFallbacks[] */
                offset+=count;
                count=mbcsHeader.countToUFallbacks*8;
                ds->swapArray32(ds, inBytes+offset, (int32_t)count,
                                   outBytes+offset, pErrorCode);

                /* swap the unicodeCodeUnits[] */
                offset=mbcsHeader.offsetToUCodeUnits;
                count=mbcsHeader.offsetFromUTable-offset;
                ds->swapArray16(ds, inBytes+offset, (int32_t)count,
                                   outBytes+offset, pErrorCode);

                /* offset to the stage 1 table, independent of the outputType */
                offset=mbcsHeader.offsetFromUTable;

                if(outputType==MBCS_OUTPUT_1) {
                    /* SBCS: swap the fromU tables, all 16 bits wide */
                    count=(mbcsHeader.offsetFromUBytes-offset)+mbcsHeader.fromUBytesLength;
                    ds->swapArray16(ds, inBytes+offset, (int32_t)count,
                                       outBytes+offset, pErrorCode);
                } else {
                    /* otherwise: swap the stage tables separately */

                    /* stage 1 table: uint16_t[0x440 or 0x40] */
                    if(inStaticData->unicodeMask&UCNV_HAS_SUPPLEMENTARY) {
                        count=0x440*2; /* for all of Unicode */
                    } else {
                        count=0x40*2; /* only BMP */
                    }
                    ds->swapArray16(ds, inBytes+offset, (int32_t)count,
                                       outBytes+offset, pErrorCode);

                    /* stage 2 table: uint32_t[] */
                    offset+=count;
                    count=mbcsHeader.offsetFromUBytes-offset;
                    ds->swapArray32(ds, inBytes+offset, (int32_t)count,
                                       outBytes+offset, pErrorCode);

                    /* stage 3/result bytes: sometimes uint16_t[] or uint32_t[] */
                    offset=mbcsHeader.offsetFromUBytes;
                    count= noFromU ? 0 : mbcsHeader.fromUBytesLength;
                    switch(outputType) {
                    case MBCS_OUTPUT_2:
                    case MBCS_OUTPUT_3_EUC:
                    case MBCS_OUTPUT_2_SISO:
                        ds->swapArray16(ds, inBytes+offset, (int32_t)count,
                                           outBytes+offset, pErrorCode);
                        break;
                    case MBCS_OUTPUT_4:
                        ds->swapArray32(ds, inBytes+offset, (int32_t)count,
                                           outBytes+offset, pErrorCode);
                        break;
                    default:
                        /* just uint8_t[], nothing to swap */
                        break;
                    }

                    if(mbcsIndexLength!=0) {
                        offset+=count;
                        count=mbcsIndexLength;
                        ds->swapArray16(ds, inBytes+offset, (int32_t)count,
                                           outBytes+offset, pErrorCode);
                    }
                }
            }

            if(extOffset!=0) {
                /* swap the extension data */
                inBytes+=extOffset;
                outBytes+=extOffset;

                /* swap toUTable[] */
                offset=udata_readInt32(ds, inExtIndexes[UCNV_EXT_TO_U_INDEX]);
                length=udata_readInt32(ds, inExtIndexes[UCNV_EXT_TO_U_LENGTH]);
                ds->swapArray32(ds, inBytes+offset, length*4, outBytes+offset, pErrorCode);

                /* swap toUUChars[] */
                offset=udata_readInt32(ds, inExtIndexes[UCNV_EXT_TO_U_UCHARS_INDEX]);
                length=udata_readInt32(ds, inExtIndexes[UCNV_EXT_TO_U_UCHARS_LENGTH]);
                ds->swapArray16(ds, inBytes+offset, length*2, outBytes+offset, pErrorCode);

                /* swap fromUTableUChars[] */
                offset=udata_readInt32(ds, inExtIndexes[UCNV_EXT_FROM_U_UCHARS_INDEX]);
                length=udata_readInt32(ds, inExtIndexes[UCNV_EXT_FROM_U_LENGTH]);
                ds->swapArray16(ds, inBytes+offset, length*2, outBytes+offset, pErrorCode);

                /* swap fromUTableValues[] */
                offset=udata_readInt32(ds, inExtIndexes[UCNV_EXT_FROM_U_VALUES_INDEX]);
                /* same length as for fromUTableUChars[] */
                ds->swapArray32(ds, inBytes+offset, length*4, outBytes+offset, pErrorCode);

                /* no need to swap fromUBytes[] */

                /* swap fromUStage12[] */
                offset=udata_readInt32(ds, inExtIndexes[UCNV_EXT_FROM_U_STAGE_12_INDEX]);
                length=udata_readInt32(ds, inExtIndexes[UCNV_EXT_FROM_U_STAGE_12_LENGTH]);
                ds->swapArray16(ds, inBytes+offset, length*2, outBytes+offset, pErrorCode);

                /* swap fromUStage3[] */
                offset=udata_readInt32(ds, inExtIndexes[UCNV_EXT_FROM_U_STAGE_3_INDEX]);
                length=udata_readInt32(ds, inExtIndexes[UCNV_EXT_FROM_U_STAGE_3_LENGTH]);
                ds->swapArray16(ds, inBytes+offset, length*2, outBytes+offset, pErrorCode);

                /* swap fromUStage3b[] */
                offset=udata_readInt32(ds, inExtIndexes[UCNV_EXT_FROM_U_STAGE_3B_INDEX]);
                length=udata_readInt32(ds, inExtIndexes[UCNV_EXT_FROM_U_STAGE_3B_LENGTH]);
                ds->swapArray32(ds, inBytes+offset, length*4, outBytes+offset, pErrorCode);

                /* swap indexes[] */
                length=udata_readInt32(ds, inExtIndexes[UCNV_EXT_INDEXES_LENGTH]);
                ds->swapArray32(ds, inBytes, length*4, outBytes, pErrorCode);
            }
        }
    } else {
        udata_printError(ds, "ucnv_swap(): unknown conversionType=%d!=UCNV_MBCS\n",
                         inStaticData->conversionType);
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    return headerSize+(int32_t)staticDataSize+size;
}